

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_service_interface(t_perl_generator *this,t_service *tservice)

{
  int *piVar1;
  t_service *ptVar2;
  t_function *tfunction;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  t_perl_generator *this_00;
  _Alloc_hider _Var5;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_if;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ofstream_with_content_based_conditional_update *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string(local_90,"",(allocator *)&local_d8);
  ptVar2 = tservice->extends_;
  if (ptVar2 != (t_service *)0x0) {
    perl_namespace_abi_cxx11_(&local_70,this,(ptVar2->super_t_type).program_);
    std::operator+(&local_b0,"use base qw(",&local_70);
    iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    std::operator+(&local_f8,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3));
    std::operator+(&local_d8,&local_f8,"If);");
    std::__cxx11::string::operator=(local_90,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  local_b8 = &this->f_service_;
  poVar4 = std::operator<<((ostream *)local_b8,"package ");
  perl_namespace_abi_cxx11_(&local_d8,this,(this->super_t_oop_generator).super_t_generator.program_)
  ;
  poVar4 = std::operator<<(poVar4,(string *)&local_d8);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar4 = std::operator<<(poVar4,"If;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"use strict;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,local_90);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_f8,&tservice->functions_)
  ;
  for (_Var5._M_p = local_f8._M_dataplus._M_p; _Var5._M_p != (pointer)local_f8._M_string_length;
      _Var5._M_p = _Var5._M_p + 8) {
    poVar4 = std::operator<<((ostream *)local_b8,"sub ");
    tfunction = *(t_function **)_Var5._M_p;
    this_00 = (t_perl_generator *)0x2cc953;
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_b0);
    function_signature(&local_d8,this_00,tfunction,&local_50);
    poVar4 = std::operator<<(poVar4,(string *)&local_d8);
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"  die \'implement interface\';\n}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            ((_Vector_base<t_function_*,_std::allocator<t_function_*>_> *)&local_f8);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void t_perl_generator::generate_service_interface(t_service* tservice) {
  string extends_if = "";
  t_service* extends_s = tservice->get_extends();
  if (extends_s != nullptr) {
    extends_if = "use base qw(" + perl_namespace(extends_s->get_program()) + extends_s->get_name()
                 + "If);";
  }

  f_service_ << "package " << perl_namespace(program_) << service_name_ << "If;" << endl << endl
             << "use strict;" << endl << extends_if << endl << endl;

  indent_up();
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << "sub " << function_signature(*f_iter) << endl << "  die 'implement interface';\n}"
               << endl << endl;
  }
  indent_down();
}